

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode Curl_senddata(Curl_easy *data,void *buffer,size_t buflen,ssize_t *n)

{
  CURLcode CVar1;
  CURLcode CVar2;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  sigpipe_ignore pipe_st;
  curl_socket_t local_e4;
  connectdata *local_e0;
  long local_d8;
  sigpipe_ignore local_d0;
  
  local_e0 = (connectdata *)0x0;
  CVar1 = easy_connection(data,&local_e4,&local_e0);
  if (CVar1 == CURLE_OK) {
    if (data->conn == (connectdata *)0x0) {
      Curl_attach_connection(data,local_e0);
    }
    *n = 0;
    sigpipe_ignore(data,&local_d0);
    CVar2 = Curl_write(data,local_e4,buffer,buflen,&local_d8);
    if (local_d0.no_signal == false) {
      sigaction(0xd,(sigaction *)&local_d0,(sigaction *)0x0);
    }
    if (local_d8 == -1) {
      CVar1 = CURLE_SEND_ERROR;
    }
    else {
      CVar1 = CURLE_AGAIN;
      if (CVar2 != CURLE_OK || local_d8 != 0) {
        *n = local_d8;
        CVar1 = CVar2;
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_senddata(struct Curl_easy *data, const void *buffer,
                       size_t buflen, ssize_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c = NULL;
  SIGPIPE_VARIABLE(pipe_st);

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connection(data, c);

  *n = 0;
  sigpipe_ignore(data, &pipe_st);
  result = Curl_write(data, sfd, buffer, buflen, &n1);
  sigpipe_restore(&pipe_st);

  if(n1 == -1)
    return CURLE_SEND_ERROR;

  /* detect EAGAIN */
  if(!result && !n1)
    return CURLE_AGAIN;

  *n = n1;

  return result;
}